

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O2

StdGrammarToken * __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::GetNextToken
          (BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *this,
          StdGrammarToken *token)

{
  size_t *psVar1;
  ulong uVar2;
  size_t sVar3;
  StreamBlock *this_00;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  size_t local_30;
  size_t sStack_28;
  
  uVar2 = this->ThisPos;
  if (uVar2 != 0x200) {
    if (this->LengthLeft == 0) {
      local_58._0_4_ = 1;
      local_50._M_p = (pointer)&local_40;
      local_48 = 0;
      local_40._M_local_buf[0] = '\0';
      local_30 = 0;
      sStack_28 = 0;
      Generator::StdGrammarToken::operator=(token,(StdGrammarToken *)local_58);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else if (uVar2 < this->pThisBlock->Count) {
      Generator::StdGrammarToken::operator=(token,this->pThisBlock->Tokens + uVar2);
      sVar3 = this->ThisPos + 1;
      this->ThisPos = sVar3;
      if (sVar3 == 0x200) {
        this->ThisPos = 0;
        this->pThisBlock = this->pThisBlock->pNext;
      }
    }
    else {
      (*this->pSourceStream->_vptr_TokenStream[2])(this->pSourceStream,token);
      Generator::StdGrammarToken::operator=(this->pThisBlock->Tokens + this->ThisPos,token);
      if (this->SourceEOFFlag == false) {
        if ((token->super_TokenCode).Code == 1) {
          this->SourceEOFFlag = true;
        }
        sVar3 = this->ThisPos + 1;
        this->ThisPos = sVar3;
        psVar1 = &this->pThisBlock->Count;
        *psVar1 = *psVar1 + 1;
        this->Pos = this->Pos + 1;
        if (sVar3 == 0x200) {
          this_00 = (StreamBlock *)operator_new(0x7018);
          StreamBlock::StreamBlock(this_00);
          this->ThisPos = 0;
          this->pThisBlock->pNext = this_00;
          this->pThisBlock = this_00;
          this_00->Index = this->Pos;
          ReleaseExtraBuffers(this);
        }
      }
    }
    return token;
  }
  __assert_fail("ThisPos != StreamBlock::BufferSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./BacktrackingTokenStream.h"
                ,0x14d,
                "virtual Token &SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::GetNextToken(Token &) [Token = SGParser::Generator::StdGrammarToken]"
               );
}

Assistant:

Token& BacktrackingTokenStream<Token>::GetNextToken(Token& token) {
    // Check if we are in the correct state, i.e.
    // there is a StreamBlock to save the next token
    SG_ASSERT(ThisPos != StreamBlock::BufferSize);

    // Zero length - return EOF Token
    if (LengthLeft == 0u) {
        token = Token{};
        return token;
    }

    // If we are behind the end (backtracked)
    // return next consecutive token
    if (ThisPos < pThisBlock->Count) {
        token = pThisBlock->Tokens[ThisPos];
        ++ThisPos;
        if (ThisPos == StreamBlock::BufferSize) {
            ThisPos    = 0u;
            pThisBlock = pThisBlock->pNext;
        }
        return token;
    }

    // Read next token from original stream
    pSourceStream->GetNextToken(token);
    pThisBlock->Tokens[ThisPos] = token;

    // If source ended earlier, just return EOF value
    if (SourceEOFFlag)
        return token;
    if (token.Code == TokenCode::TokenEOF)
        SourceEOFFlag = true;

    // Increase pointer
    ++ThisPos;
    ++pThisBlock->Count;
    // Final position in stream
    ++Pos;
    if (ThisPos == StreamBlock::BufferSize) {
        // Enforce basic exception safety
        // If new StreamBlock fails then ThisPos will stay equal
        // to StreamBlock::BufferSize and next call to GetNextToken
        // will fail (but BacktrackingTokenStream will stay in safe-to-delete state)
        const auto newBlock = new StreamBlock;
        ThisPos             = 0u;
        pThisBlock->pNext   = newBlock;
        pThisBlock          = pThisBlock->pNext;
        pThisBlock->Index   = Pos;
        // Check for freeing any extra buffers
        ReleaseExtraBuffers();
    }
    return token;
}